

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::readNumericalWords(string *ustring,size_t *index)

{
  char *pcVar1;
  double dVar2;
  undefined *puVar3;
  undefined *puVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t __n;
  size_type sVar9;
  ulong uVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  size_t index_sub;
  string lcstring;
  double local_a8;
  size_t local_98;
  double local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  double local_48;
  undefined8 uStack_40;
  
  *index = 0;
  local_a8 = NAN;
  if (2 < ustring->_M_string_length) {
    if (hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0') {
      iVar6 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                   first_letters_abi_cxx11_);
      if (iVar6 != 0) {
        hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ =
             &DAT_005787a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    first_letters_abi_cxx11_,"otfsenhmbtzaOTFSENHMBTZA","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                      first_letters_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                             first_letters_abi_cxx11_);
      }
    }
    if (hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0')
    {
      iVar6 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                   second_letters_abi_cxx11_);
      if (iVar6 != 0) {
        hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ =
             &DAT_005787c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    second_letters_abi_cxx11_,"nwhoielurNWHOIELUR","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                      second_letters_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                             second_letters_abi_cxx11_);
      }
    }
    puVar3 = hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_;
    local_a8 = NAN;
    if (DAT_00578798 != 0) {
      pcVar1 = (ustring->_M_dataplus)._M_p;
      pvVar8 = memchr(hasValidNumericalWordStart(std::__cxx11::string_const&)::
                      first_letters_abi_cxx11_,(int)*pcVar1,DAT_00578798);
      puVar4 = hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_;
      if (((long)pvVar8 - (long)puVar3 != -1 && pvVar8 != (void *)0x0) && (_DAT_005787c0 != 0)) {
        pvVar8 = memchr(hasValidNumericalWordStart(std::__cxx11::string_const&)::
                        second_letters_abi_cxx11_,(int)pcVar1[1],_DAT_005787c0);
        if ((long)pvVar8 - (long)puVar4 != -1 && pvVar8 != (void *)0x0) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar1,pcVar1 + ustring->_M_string_length);
          sVar9 = local_88._M_string_length;
          _Var5._M_p = local_88._M_dataplus._M_p;
          if (local_88._M_string_length != 0) {
            uVar10 = 0;
            do {
              iVar6 = tolower((int)_Var5._M_p[uVar10]);
              _Var5._M_p[uVar10] = (char)iVar6;
              uVar10 = uVar10 + 1;
            } while (sVar9 != uVar10);
          }
          lVar11 = 0;
          do {
            pcVar1 = *(char **)((long)&DAT_005674e0 + lVar11);
            __n = strlen(pcVar1);
            sVar9 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              (&local_88,pcVar1,0,__n);
            if (sVar9 != 0xffffffffffffffff) {
              if (sVar9 == 0) {
                local_98 = 0;
                local_a8 = *(double *)((long)&DAT_005674d8 + lVar11);
                sVar9 = (size_type)*(int *)((long)&groupNumericalWords + lVar11);
                *index = sVar9;
                if (sVar9 < local_88._M_string_length) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            (&local_68,&local_88,sVar9,0xffffffffffffffff);
                  dVar2 = readNumericalWords((string *)&local_68,&local_98);
                  uVar12 = SUB84(dVar2,0);
                  uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p != &local_68.field_2) {
                    local_90 = dVar2;
                    operator_delete(local_68._M_dataplus._M_p,
                                    local_68.field_2._M_allocated_capacity + 1);
                    uVar12 = SUB84(local_90,0);
                    uVar13 = (undefined4)((ulong)local_90 >> 0x20);
                  }
                  if (!NAN((double)CONCAT44(uVar13,uVar12)) && !NAN((double)CONCAT44(uVar13,uVar12))
                     ) {
                    uVar10 = -(ulong)((double)CONCAT44(uVar13,uVar12) < local_a8);
                    local_a8 = (double)(~uVar10 & (ulong)(local_a8 * (double)CONCAT44(uVar13,uVar12)
                                                         ) |
                                       (ulong)(local_a8 + (double)CONCAT44(uVar13,uVar12)) & uVar10)
                    ;
                    *index = *index + local_98;
                  }
                }
              }
              else {
                local_98 = 0;
                local_90 = *(double *)((long)&DAT_005674d8 + lVar11);
                uVar10 = (long)*(int *)((long)&groupNumericalWords + lVar11) + sVar9;
                *index = uVar10;
                local_48 = 0.0;
                uStack_40 = 0;
                if (uVar10 < local_88._M_string_length) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            (&local_68,&local_88,uVar10,0xffffffffffffffff);
                  dVar2 = readNumericalWords((string *)&local_68,&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p != &local_68.field_2) {
                    operator_delete(local_68._M_dataplus._M_p,
                                    local_68.field_2._M_allocated_capacity + 1);
                  }
                  if (!NAN(dVar2) && !NAN(dVar2)) {
                    local_48 = (double)(-(ulong)(dVar2 < local_90) & (ulong)dVar2);
                    uStack_40 = 0;
                    if (local_90 <= dVar2) {
                      local_90 = local_90 * dVar2;
                    }
                    *index = *index + local_98;
                  }
                }
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_68,&local_88,0,sVar9);
                local_a8 = readNumericalWords((string *)&local_68,&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                }
                if ((NAN(local_a8)) || (local_98 < sVar9)) {
                  *index = local_98;
                }
                else {
                  local_a8 = local_48 + local_90 * local_a8;
                }
              }
              goto LAB_003ef70d;
            }
            lVar11 = lVar11 + 0x18;
          } while (lVar11 != 0x90);
          iVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (&local_88,0,3,"and");
          if (iVar6 == 0) {
            *index = *index + 3;
          }
          lVar11 = 0x10;
          do {
            iVar6 = *(int *)(&UNK_00567550 + lVar11);
            iVar7 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&local_88,*index,(long)iVar6,*(char **)((long)&decadeWords + lVar11))
            ;
            if (iVar7 == 0) {
              uVar10 = (long)iVar6 + *index;
              local_a8 = *(double *)(&UNK_00567558 + lVar11);
              *index = uVar10;
              if (uVar10 < local_88._M_string_length) {
                if (local_88._M_dataplus._M_p[uVar10] == '-') {
                  *index = uVar10 + 1;
                }
                dVar2 = read1To10((string *)&local_88,index);
                local_a8 = (double)((ulong)local_a8 & -(ulong)NAN(dVar2) |
                                   ~-(ulong)NAN(dVar2) & (ulong)(local_a8 + dVar2));
              }
              goto LAB_003ef70d;
            }
            lVar11 = lVar11 + 0x18;
          } while (lVar11 != 0xd0);
          lVar11 = 0x10;
          do {
            iVar6 = *(int *)(&UNK_005676e8 + lVar11);
            iVar7 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&local_88,*index,(long)iVar6,*(char **)((long)&teens + lVar11));
            if (iVar7 == 0) {
              *index = *index + (long)iVar6;
              local_a8 = *(double *)(&UNK_005676f0 + lVar11);
              if (!NAN(local_a8)) goto LAB_003ef70d;
              break;
            }
            lVar11 = lVar11 + 0x18;
          } while (lVar11 != 0x118);
          local_a8 = read1To10((string *)&local_88,index);
LAB_003ef70d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return local_a8;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}